

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastpackwithoutmask15_8(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in;
  *out = in[1] << 0xf | *out;
  *out = in[2] << 0x1e | *out;
  puVar1 = out + 1;
  *puVar1 = in[2] >> 2;
  *puVar1 = in[3] << 0xd | *puVar1;
  *puVar1 = in[4] << 0x1c | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[4] >> 4;
  *puVar1 = in[5] << 0xb | *puVar1;
  *puVar1 = in[6] << 0x1a | *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[6] >> 6;
  *puVar1 = in[7] << 9 | *puVar1;
  return out + 4;
}

Assistant:

uint32_t *__fastpackwithoutmask15_8(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 15;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (15 - 13);
  ++in;
  *out |= ((*in)) << 13;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (15 - 11);
  ++in;
  *out |= ((*in)) << 11;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (15 - 9);
  ++in;
  *out |= ((*in)) << 9;
  ++in;

  return out + 1;
}